

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer_on_shmem.cpp
# Opt level: O0

bool __thiscall SharedMemRingBuffer::Terminate(SharedMemRingBuffer *this)

{
  bool bVar1;
  SharedMemoryManager *in_RDI;
  undefined1 local_1;
  
  bVar1 = SharedMemoryManager::DetachShMem(in_RDI);
  if (bVar1) {
    bVar1 = SharedMemoryManager::RemoveShMem(in_RDI);
    if (bVar1) {
      bVar1 = SharedMemoryManager::DetachShMem(in_RDI);
      if (bVar1) {
        bVar1 = SharedMemoryManager::RemoveShMem(in_RDI);
        if (bVar1) {
          local_1 = true;
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SharedMemRingBuffer::Terminate()
{
    if(! shared_index_buffer_.DetachShMem()) {
        DEBUG_ELOG("Error"); 
        return false;
    }
    if(! shared_index_buffer_.RemoveShMem()) {
        DEBUG_ELOG("Error"); 
        return false;
    }
    if(! shared_raw_memory_buffer_.DetachShMem()) {
        DEBUG_ELOG("Error"); 
        return false;
    }
    if(! shared_raw_memory_buffer_.RemoveShMem()) {
        DEBUG_ELOG("Error"); 
        return false;
    }
    return true;
}